

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* anon_unknown.dwarf_dce8de::wrapOptions
            (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *options,cmListFileBacktrace *bt,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *wrapperFlag,string *wrapperSep,bool concatFlagAndArgs)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ulong uVar5;
  reference pbVar6;
  const_reference __lhs;
  iterator __first;
  iterator __last;
  iterator __result;
  reference pbVar7;
  string_view sVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  e;
  const_iterator i_2;
  string *o_1;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string_view local_1e0;
  string_view local_1d0;
  string local_1c0;
  reference local_1a0;
  string *i_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string_view local_170;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  const_iterator i;
  undefined1 local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  ulong local_70;
  size_type index;
  string *o;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool concatFlagAndArgs_local;
  string *wrapperSep_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *wrapperFlag_local;
  cmListFileBacktrace *bt_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *options_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result;
  
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(options);
  if (!bVar1) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(wrapperFlag);
    if (bVar1) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(options);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve(__return_storage_ptr__,sVar2);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(options);
      o = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(options);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&o), bVar1) {
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   __return_storage_ptr__,pbVar7,bt);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    else {
      local_70 = 0;
      while( true ) {
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(options);
        if (sVar2 <= local_70) break;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](options,local_70);
        sVar8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3);
        bVar1 = cmHasLiteralPrefix<8ul>(sVar8,(char (*) [8])"LINKER:");
        if (bVar1) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](options,local_70);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,pvVar3,bt);
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](options,local_70);
          sVar8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3);
          bVar1 = cmHasLiteralPrefix<5ul>(sVar8,(char (*) [5])"-Wl,");
          if (bVar1) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](options,local_70);
            pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::__cxx11::string::replace((ulong)pvVar3,0,(char *)0x4);
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string&,cmListFileBacktrace_const&>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       __return_storage_ptr__,pbVar4,bt);
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](options,local_70);
            sVar8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3);
            bVar1 = cmHasLiteralPrefix<10ul>(sVar8,(char (*) [10])"-Xlinker=");
            if (bVar1) {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](options,local_70);
              pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::__cxx11::string::replace((ulong)pvVar3,0,(char *)0x9);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string&,cmListFileBacktrace_const&>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)__return_storage_ptr__,pbVar4,bt);
            }
            else {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](options,local_70);
              bVar1 = std::operator==(pvVar3,"-Xlinker");
              if (bVar1) {
                sVar2 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(options);
                if (local_70 + 1 < sVar2) {
                  local_70 = local_70 + 1;
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](options,local_70);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&opts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,"LINKER:",
                                 pvVar3);
                  std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                  emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              *)__return_storage_ptr__,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &opts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,bt);
                  std::__cxx11::string::~string
                            ((string *)
                             &opts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                else {
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](options,local_70);
                  std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                  emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              *)__return_storage_ptr__,pvVar3,bt);
                }
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_d8);
                while( true ) {
                  sVar2 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(options);
                  if (sVar2 <= local_70) break;
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](options,local_70);
                  sVar8 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3)
                  ;
                  bVar1 = cmHasLiteralPrefix<8ul>(sVar8,(char (*) [8])"LINKER:");
                  if (bVar1) {
LAB_006bc27d:
                    local_70 = local_70 - 1;
                    break;
                  }
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](options,local_70);
                  sVar8 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3)
                  ;
                  bVar1 = cmHasLiteralPrefix<5ul>(sVar8,(char (*) [5])"-Wl,");
                  if (bVar1) goto LAB_006bc27d;
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](options,local_70);
                  sVar8 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3)
                  ;
                  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)sVar8._M_len;
                  bVar1 = cmHasLiteralPrefix<9ul>(sVar8,(char (*) [9])"-Xlinker");
                  if (bVar1) goto LAB_006bc27d;
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](options,local_70);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_d8,pvVar3);
                  local_70 = local_70 + 1;
                }
                bVar1 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_d8);
                if (!bVar1) {
                  uVar5 = std::__cxx11::string::empty();
                  if ((uVar5 & 1) == 0) {
                    if (concatFlagAndArgs) {
                      local_110._M_current =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::begin(wrapperFlag);
                      while( true ) {
                        local_120._M_current =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end(wrapperFlag);
                        local_118 = __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator-(&local_120,1);
                        bVar1 = __gnu_cxx::operator!=(&local_110,&local_118);
                        if (!bVar1) break;
                        pbVar6 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&local_110);
                        std::
                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    *)__return_storage_ptr__,pbVar6,bt);
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++(&local_110);
                      }
                      __lhs = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::back(wrapperFlag);
                      sVar8 = (string_view)
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)wrapperSep);
                      local_170 = sVar8;
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                ((basic_string_view<char,_std::char_traits<char>_> *)&__range4);
                      cmJoin(&local_160,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d8,local_170,___range4);
                      std::operator+(&local_140,__lhs,&local_160);
                      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  *)__return_storage_ptr__,&local_140,bt);
                      std::__cxx11::string::~string((string *)&local_140);
                      std::__cxx11::string::~string((string *)&local_160);
                    }
                    else {
                      __end4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::begin(wrapperFlag);
                      i_1 = (string *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end(wrapperFlag);
                      while( true ) {
                        bVar1 = __gnu_cxx::operator!=
                                          (&__end4,(
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&i_1);
                        if (!bVar1) break;
                        local_1a0 = __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator*(&__end4);
                        std::
                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    *)__return_storage_ptr__,local_1a0,bt);
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++(&__end4);
                      }
                      sVar8 = (string_view)
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)wrapperSep);
                      local_1d0 = sVar8;
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (&local_1e0);
                      cmJoin(&local_1c0,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d8,local_1d0,local_1e0);
                      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  *)__return_storage_ptr__,&local_1c0,bt);
                      std::__cxx11::string::~string((string *)&local_1c0);
                    }
                  }
                  else {
                    if (concatFlagAndArgs) {
                      __first = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_d8);
                      __last = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_d8);
                      __result = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_d8);
                      std::
                      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(anonymous_namespace)::wrapOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,cmListFileBacktrace_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,bool)::__0>
                                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )__first._M_current,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )__last._M_current,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )__result._M_current,(anon_class_8_1_888160ff)wrapperFlag);
                    }
                    __end3 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_d8);
                    o_1 = (string *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_d8);
                    while( true ) {
                      bVar1 = __gnu_cxx::operator!=
                                        (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&o_1);
                      if (!bVar1) break;
                      pbVar7 = __gnu_cxx::
                               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*(&__end3);
                      e._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::begin(wrapperFlag);
                      if (concatFlagAndArgs) {
                        local_240._M_current =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end(wrapperFlag);
                        local_238 = __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator-(&local_240,1);
                      }
                      else {
                        local_238._M_current =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end(wrapperFlag);
                      }
                      while( true ) {
                        bVar1 = __gnu_cxx::operator!=(&e,&local_238);
                        if (!bVar1) break;
                        pbVar6 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&e);
                        std::
                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    *)__return_storage_ptr__,pbVar6,bt);
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++(&e);
                      }
                      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  *)__return_storage_ptr__,pbVar7,bt);
                      __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&__end3);
                    }
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_d8);
              }
            }
          }
        }
        local_70 = local_70 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> wrapOptions(
  std::vector<std::string>& options, const cmListFileBacktrace& bt,
  const std::vector<std::string>& wrapperFlag, const std::string& wrapperSep,
  bool concatFlagAndArgs)
{
  std::vector<BT<std::string>> result;

  if (options.empty()) {
    return result;
  }

  if (wrapperFlag.empty()) {
    // nothing specified, insert elements as is
    result.reserve(options.size());
    for (std::string& o : options) {
      result.emplace_back(std::move(o), bt);
    }
    return result;
  }

  for (std::vector<std::string>::size_type index = 0; index < options.size();
       index++) {
    if (cmHasLiteralPrefix(options[index], "LINKER:")) {
      // LINKER wrapper specified, insert elements as is
      result.emplace_back(std::move(options[index]), bt);
      continue;
    }
    if (cmHasLiteralPrefix(options[index], "-Wl,")) {
      // replace option by LINKER wrapper
      result.emplace_back(options[index].replace(0, 4, "LINKER:"), bt);
      continue;
    }
    if (cmHasLiteralPrefix(options[index], "-Xlinker=")) {
      // replace option by LINKER wrapper
      result.emplace_back(options[index].replace(0, 9, "LINKER:"), bt);
      continue;
    }
    if (options[index] == "-Xlinker") {
      // replace option by LINKER wrapper
      if (index + 1 < options.size()) {
        result.emplace_back("LINKER:" + options[++index], bt);
      } else {
        result.emplace_back(std::move(options[index]), bt);
      }
      continue;
    }

    // collect all options which must be transformed
    std::vector<std::string> opts;
    while (index < options.size()) {
      if (!cmHasLiteralPrefix(options[index], "LINKER:") &&
          !cmHasLiteralPrefix(options[index], "-Wl,") &&
          !cmHasLiteralPrefix(options[index], "-Xlinker")) {
        opts.emplace_back(std::move(options[index++]));
      } else {
        --index;
        break;
      }
    }
    if (opts.empty()) {
      continue;
    }

    if (!wrapperSep.empty()) {
      if (concatFlagAndArgs) {
        // insert flag elements except last one
        for (auto i = wrapperFlag.begin(); i != wrapperFlag.end() - 1; ++i) {
          result.emplace_back(*i, bt);
        }
        // concatenate last flag element and all list values
        // in one option
        result.emplace_back(wrapperFlag.back() + cmJoin(opts, wrapperSep), bt);
      } else {
        for (std::string const& i : wrapperFlag) {
          result.emplace_back(i, bt);
        }
        // concatenate all list values in one option
        result.emplace_back(cmJoin(opts, wrapperSep), bt);
      }
    } else {
      // prefix each element of list with wrapper
      if (concatFlagAndArgs) {
        std::transform(opts.begin(), opts.end(), opts.begin(),
                       [&wrapperFlag](std::string const& o) -> std::string {
                         return wrapperFlag.back() + o;
                       });
      }
      for (std::string& o : opts) {
        for (auto i = wrapperFlag.begin(),
                  e = concatFlagAndArgs ? wrapperFlag.end() - 1
                                        : wrapperFlag.end();
             i != e; ++i) {
          result.emplace_back(*i, bt);
        }
        result.emplace_back(std::move(o), bt);
      }
    }
  }
  return result;
}